

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> * __thiscall
pbrt::ParameterDictionary::GetRGBArray
          (vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  char *pcVar3;
  size_t __n;
  byte bVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined8 unaff_RBP;
  long lVar8;
  ulong uVar9;
  long lVar10;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar11;
  bool bVar12;
  undefined1 auVar13 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar14 [32];
  undefined1 auVar23 [64];
  undefined1 auVar15 [32];
  undefined1 auVar24 [64];
  allocator_type local_39;
  vector<pbrt::RGB,_std::allocator<pbrt::RGB>_> *local_38;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar11 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar11 = paVar1;
  }
  lVar8 = CONCAT71((int7)((ulong)unaff_RBP >> 8),sVar2 == 0);
  local_38 = __return_storage_ptr__;
  if (sVar2 != 0) {
    lVar10 = 0;
    do {
      pcVar3 = *(char **)((long)paVar11 + lVar10);
      __n = *(size_t *)(pcVar3 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar7 = bcmp(*(void **)(pcVar3 + 0x20),(name->_M_dataplus)._M_p,__n), iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare(pcVar3), iVar7 == 0)))) {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(pcVar3 + 0x70);
        if (0x5555555555555555 < SUB168(ZEXT816(0xaaaaaaaaaaaaaaab) * auVar6,0)) {
          ErrorExit((FileLoc *)(pcVar3 + 0x40),
                    "Number of values given for \"rgb\" parameter %d \"name\" isn\'t a multiple of 3."
                   );
        }
        std::vector<pbrt::RGB,_std::allocator<pbrt::RGB>_>::vector
                  (local_38,*(ulong *)(pcVar3 + 0x70) / 3,&local_39);
        if (2 < *(ulong *)(pcVar3 + 0x70)) {
          lVar10 = *(long *)(pcVar3 + 0x60);
          uVar9 = *(ulong *)(pcVar3 + 0x70) / 3 + 7 & 0xfffffffffffffff8;
          auVar16 = vpbroadcastq_avx512f();
          auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar18 = vpbroadcastq_avx512f(ZEXT816(0xc));
          auVar19 = vpbroadcastq_avx512f();
          auVar20 = vpbroadcastq_avx512f(ZEXT816(8));
          do {
            uVar5 = vpcmpuq_avx512f(auVar17,auVar16,2);
            auVar21 = vpaddq_avx512f(auVar17,auVar17);
            vpaddq_avx512f(auVar21,auVar17);
            auVar21 = vgatherqpd_avx512f(*(undefined8 *)(lVar10 + lVar8 * 8));
            bVar4 = (byte)uVar5;
            auVar24._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar21._8_8_;
            auVar24._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
            auVar24._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar21._16_8_;
            auVar24._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar21._24_8_;
            auVar24._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar21._32_8_;
            auVar24._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar21._40_8_;
            auVar24._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar21._48_8_;
            auVar24._56_8_ = (uVar5 >> 7) * auVar21._56_8_;
            auVar13 = vcvtpd2ps_avx512f(auVar24);
            auVar21 = vgatherqpd_avx512f(*(undefined8 *)(lVar10 + 8 + lVar8 * 8));
            auVar22._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar21._8_8_;
            auVar22._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
            auVar22._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar21._16_8_;
            auVar22._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar21._24_8_;
            auVar22._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar21._32_8_;
            auVar22._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar21._40_8_;
            auVar22._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar21._48_8_;
            auVar22._56_8_ = (uVar5 >> 7) * auVar21._56_8_;
            auVar14 = vcvtpd2ps_avx512f(auVar22);
            auVar21 = vgatherqpd_avx512f(*(undefined8 *)(lVar10 + 0x10 + lVar8 * 8));
            auVar23._8_8_ = (ulong)((byte)(uVar5 >> 1) & 1) * auVar21._8_8_;
            auVar23._0_8_ = (ulong)(bVar4 & 1) * auVar21._0_8_;
            auVar23._16_8_ = (ulong)((byte)(uVar5 >> 2) & 1) * auVar21._16_8_;
            auVar23._24_8_ = (ulong)((byte)(uVar5 >> 3) & 1) * auVar21._24_8_;
            auVar23._32_8_ = (ulong)((byte)(uVar5 >> 4) & 1) * auVar21._32_8_;
            auVar23._40_8_ = (ulong)((byte)(uVar5 >> 5) & 1) * auVar21._40_8_;
            auVar23._48_8_ = (ulong)((byte)(uVar5 >> 6) & 1) * auVar21._48_8_;
            auVar23._56_8_ = (uVar5 >> 7) * auVar21._56_8_;
            auVar15 = vcvtpd2ps_avx512f(auVar23);
            auVar21 = vpmullq_avx512dq(auVar17,auVar18);
            auVar24 = vpaddq_avx512f(auVar19,auVar21);
            vscatterqps_avx512f(ZEXT864((local_38->
                                        super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>).
                                        _M_impl.super__Vector_impl_data._M_start) + auVar21,uVar5,
                                auVar13);
            vscatterqps_avx512f(ZEXT864(4) + auVar24,uVar5,auVar14);
            vscatterqps_avx512f(ZEXT864(8) + auVar24,uVar5,auVar15);
            auVar17 = vpaddq_avx512f(auVar17,auVar20);
            uVar9 = uVar9 - 8;
          } while (uVar9 != 0);
        }
        pcVar3[0xb8] = '\x01';
        if ((char)lVar8 == '\0') {
          return local_38;
        }
        break;
      }
      lVar10 = lVar10 + 8;
      bVar12 = sVar2 << 3 == lVar10;
      lVar8 = CONCAT71((int7)((ulong)lVar8 >> 8),bVar12);
    } while (!bVar12);
  }
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_38->super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_38;
}

Assistant:

std::vector<RGB> ParameterDictionary::GetRGBArray(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() % 3)
                ErrorExit(&p->loc, "Number of values given for \"rgb\" parameter %d "
                                   "\"name\" isn't a multiple of 3.");

            std::vector<RGB> rgb(p->numbers.size() / 3);
            for (int i = 0; i < p->numbers.size() / 3; ++i)
                rgb[i] =
                    RGB(p->numbers[3 * i], p->numbers[3 * i + 1], p->numbers[3 * i + 2]);

            p->lookedUp = true;
            return rgb;
        }
    }
    return {};
}